

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushID(int int_id)

{
  ImVector<unsigned_int> *this;
  ImGuiID local_24;
  ImGuiWindow *local_20;
  ImGuiWindow *window;
  void *ptr_id;
  int int_id_local;
  
  window = (ImGuiWindow *)(long)int_id;
  local_20 = GImGui->CurrentWindow;
  this = &local_20->IDStack;
  ptr_id._4_4_ = int_id;
  local_24 = ImGuiWindow::GetIDNoKeepAlive(local_20,window);
  ImVector<unsigned_int>::push_back(this,&local_24);
  return;
}

Assistant:

void ImGui::PushID(int int_id)
{
    const void* ptr_id = (void*)(intptr_t)int_id;
    ImGuiWindow* window = GImGui->CurrentWindow;
    window->IDStack.push_back(window->GetIDNoKeepAlive(ptr_id));
}